

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

bool jsoncons::detail::dtoa_scientific<jsoncons::stream_sink<char>>
               (double val,char decimal_point,stream_sink<char> *result)

{
  uint uVar1;
  bool bVar2;
  type_conflict7 tVar3;
  chars_to to_double;
  char buffer [100];
  
  if ((val == 0.0) && (!NAN(val))) {
    stream_sink<char>::push_back(result,'0');
    stream_sink<char>::push_back(result,'.');
    stream_sink<char>::push_back(result,'0');
    return true;
  }
  chars_to::chars_to(&to_double);
  uVar1 = snprintf(buffer,100,"%1.*e",val,0xf);
  if (-1 < (int)uVar1) {
    tVar3 = chars_to::operator()(&to_double,buffer,100);
    if (((tVar3 == val) && (!NAN(tVar3) && !NAN(val))) ||
       (uVar1 = snprintf(buffer,100,"%1.*e",val,0x11), -1 < (int)uVar1)) {
      bVar2 = true;
      dump_buffer<jsoncons::stream_sink<char>>(buffer,(ulong)uVar1,decimal_point,result);
      goto LAB_001abd3c;
    }
  }
  bVar2 = false;
LAB_001abd3c:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&to_double);
  return bVar2;
}

Assistant:

bool dtoa_scientific(double val, char decimal_point, Result& result)
    {
        if (val == 0)
        {
            result.push_back('0');
            result.push_back('.');
            result.push_back('0');
            return true;
        }

        const jsoncons::detail::chars_to to_double;

        char buffer[100];
        int precision = std::numeric_limits<double>::digits10;
        int length = snprintf(buffer, sizeof(buffer), "%1.*e", precision, val);
        if (length < 0)
        {
            return false;
        }
        if (to_double(buffer, sizeof(buffer)) != val)
        {
            const int precision2 = std::numeric_limits<double>::max_digits10;
            length = snprintf(buffer, sizeof(buffer), "%1.*e", precision2, val);
            if (length < 0)
            {
                return false;
            }
        }
        dump_buffer(buffer, static_cast<std::size_t>(length), decimal_point, result);
        return true;
    }